

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvactxinfo.c
# Opt level: O3

void print_hwinfo(void)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint32_t local_58;
  
  uVar8 = 0;
  printf("Card: NV%X\n",(ulong)dev);
  printf("SM  count             : %d\n",
         (ulong)(*(uint *)((long)nva_cards[cnum]->bar0 + 0x418bb8) >> 8 & 0xff));
  uVar1 = *(uint *)((long)nva_cards[cnum]->bar0 + 0x22430);
  printf("GPC count             : %d\n",(ulong)uVar1);
  uVar12 = 0;
  if ((ulong)uVar1 != 0) {
    local_58 = 0x504000;
    uVar10 = 0;
    uVar12 = 0;
    uVar8 = 0;
    do {
      iVar11 = (int)uVar10 * 0x8000;
      uVar9 = *(uint *)((long)nva_cards[cnum]->bar0 + (ulong)(iVar11 + 0x502608)) & 0x1f;
      printf("  GPC[%2u] TPCs        : %d\n",uVar10 & 0xffffffff,(ulong)uVar9);
      iVar2 = *(int *)((long)nva_cards[cnum]->bar0 + (ulong)(iVar11 + 0x50274c));
      printf("  GPC[%2u] base size   : %d bytes\n",uVar10 & 0xffffffff,(ulong)(uint)(iVar2 * 4));
      uVar3 = ctxsize_strands(iVar11 + 0x500000);
      printf("  GPC[%2u] strand size : %d bytes\n",uVar10 & 0xffffffff,(ulong)uVar3);
      uVar5 = uVar3 + iVar2 * 4;
      if (0x106 < dev) {
        if (uVar9 == 0) {
          uVar6 = 0;
        }
        else {
          uVar7 = 0;
          uVar6 = 0;
          uVar3 = local_58;
          do {
            uVar4 = ctxsize_tpc_strands(uVar3);
            printf("    TPC[%2u] strands   : %d bytes\n",(ulong)uVar7,(ulong)uVar4);
            uVar6 = uVar6 + uVar4;
            uVar7 = uVar7 + 1;
            uVar3 = uVar3 + 0x800;
          } while (uVar9 != uVar7);
        }
        printf("  GPC[%2u] TPC size    : %d bytes\n",uVar10 & 0xffffffff,(ulong)uVar6);
        uVar5 = uVar5 + uVar6;
      }
      printf("  GPC[%2u] ctx size    : %d bytes\n",uVar10 & 0xffffffff,(ulong)uVar5);
      uVar12 = uVar12 + uVar5;
      uVar5 = *(uint *)((long)nva_cards[cnum]->bar0 + (ulong)(iVar11 + 0x502804));
      printf("  GPC[%2u] ctx area    : %d bytes\n",uVar10 & 0xffffffff,(ulong)uVar5);
      uVar8 = uVar8 + uVar5;
      uVar10 = uVar10 + 1;
      local_58 = local_58 + 0x8000;
    } while (uVar10 != uVar1);
  }
  printf("GPC context size      : %d bytes\n",(ulong)uVar12);
  printf("GPC context area      : %d bytes\n",(ulong)uVar8);
  putchar(10);
  iVar2 = *(int *)((long)nva_cards[cnum]->bar0 + 0x40974c);
  uVar3 = ctxsize_strands(0x407000);
  uVar1 = uVar3 + iVar2 * 4;
  printf("HUB context size      : %d bytes\n",(ulong)uVar1);
  printf("Total context size    : %d bytes\n",(ulong)(uVar1 + uVar12));
  printf("Total context area    : %d bytes\n",
         (ulong)*(uint *)((long)nva_cards[cnum]->bar0 + 0x409804));
  putchar(10);
  return;
}

Assistant:

void print_hwinfo()
{
	uint32_t gpc_cnt, gpc_size, gpc_area, gpc_base, smx_cnt, tpc_cnt, tpc_base,
				tpc_size, ctx_size, size, i, j;

	printf("Card: NV%X\n", dev);

	smx_cnt = (nva_rd32(cnum, 0x418bb8) >> 8) & 0xff;
	printf("SM  count             : %d\n", smx_cnt);

	gpc_cnt = nva_rd32(cnum, 0x22430);
	printf("GPC count             : %d\n", gpc_cnt);

	gpc_size = 0;
	gpc_area = 0;
	for (i = 0; i < gpc_cnt; i++) {
		gpc_base = 0x500000 + (i * 0x8000);
		tpc_cnt = nva_rd32(cnum, gpc_base + 0x2608) & 0x1f;
		printf("  GPC[%2u] TPCs        : %d\n", i, tpc_cnt);
		ctx_size = nva_rd32(cnum, gpc_base + 0x274c) << 2;
		printf("  GPC[%2u] base size   : %d bytes\n", i, ctx_size);
		size = ctxsize_strands(gpc_base);
		printf("  GPC[%2u] strand size : %d bytes\n", i, size);
		ctx_size += size;
		if (dev >= 0x107) {
			tpc_size = 0;
			for (j = 0; j < tpc_cnt; j++) {
				size = 0;
				tpc_base = gpc_base + 0x4000 + (j * 0x800);
				size = ctxsize_tpc_strands(tpc_base);
				printf("    TPC[%2u] strands   : %d bytes\n", j, size);
				tpc_size += size;
			}
			printf("  GPC[%2u] TPC size    : %d bytes\n", i, tpc_size);
			ctx_size += tpc_size;
		}
		printf("  GPC[%2u] ctx size    : %d bytes\n", i, ctx_size);
		gpc_size += ctx_size;

		ctx_size = nva_rd32(cnum, 0x502804 + (i * 0x8000));
		printf("  GPC[%2u] ctx area    : %d bytes\n", i, ctx_size);
		gpc_area += ctx_size;
	}

	printf("GPC context size      : %d bytes\n", gpc_size);

	ctx_size = nva_rd32(cnum, 0x41a804);
	printf("GPC context area      : %d bytes\n", gpc_area);
	printf("\n");

	ctx_size = nva_rd32(cnum,0x40974c) << 2;
	ctx_size += ctxsize_strands(0x407000);
	printf("HUB context size      : %d bytes\n", ctx_size);

	printf("Total context size    : %d bytes\n", ctx_size + gpc_size);

	ctx_size = nva_rd32(cnum, 0x409804);
	printf("Total context area    : %d bytes\n", ctx_size);

	printf("\n");
}